

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

int fy_node_hash_internal(fy_node *fyn,fy_hash_update_fn update_fn,void *state)

{
  long lVar1;
  fy_node *pfVar2;
  long lVar3;
  _Bool _Var4;
  int iVar5;
  fy_node_pair **fynpp_00;
  char *pcVar6;
  fy_node_pair *apfStack_280 [2];
  fy_hash_update_fn local_270;
  uint local_264;
  fy_iter_chunk *local_260;
  fy_iter_chunk *ic;
  int local_250;
  int rc;
  int count;
  int i;
  fy_token_iter iter;
  fy_node_pair **fynpp;
  fy_node_pair *fynp;
  fy_node *fyni;
  void *state_local;
  fy_hash_update_fn update_fn_local;
  fy_node *fyn_local;
  
  if (fyn == (fy_node *)0x0) {
    apfStack_280[0] = (fy_node_pair *)0x131c54;
    (*update_fn)(state,"s",1);
  }
  else {
    local_264 = (byte)fyn->field_0x34 & 3;
    if ((fyn->field_0x34 & 3) == 0) {
      apfStack_280[0] = (fy_node_pair *)0x131e69;
      apfStack_280[1] = (fy_node_pair *)state;
      local_270 = update_fn;
      _Var4 = fy_node_is_alias(fyn);
      pcVar6 = "A";
      if (((_Var4 ^ 0xffU) & 1) != 0) {
        pcVar6 = "s";
      }
      apfStack_280[0] = (fy_node_pair *)0x131e98;
      (*local_270)(apfStack_280[1],pcVar6,1);
      apfStack_280[0] = (fy_node_pair *)0x131eac;
      fy_token_iter_start((fyn->field_12).scalar,(fy_token_iter *)&count);
      local_260 = (fy_iter_chunk *)0x0;
      while( true ) {
        apfStack_280[0] = (fy_node_pair *)0x131ed1;
        local_260 = fy_token_iter_chunk_next
                              ((fy_token_iter *)&count,local_260,(int *)((long)&ic + 4));
        if (local_260 == (fy_iter_chunk *)0x0) break;
        apfStack_280[0] = (fy_node_pair *)0x131efd;
        (*update_fn)(state,local_260->str,local_260->len);
      }
      apfStack_280[0] = (fy_node_pair *)0x131f0b;
      fy_token_iter_finish((fy_token_iter *)&count);
    }
    else if (local_264 == 1) {
      apfStack_280[0] = (fy_node_pair *)0x131cac;
      (*update_fn)(state,"S",1);
      apfStack_280[0] = (fy_node_pair *)0x131cb9;
      for (fynp = (fy_node_pair *)fy_node_list_head(&(fyn->field_12).sequence);
          fynp != (fy_node_pair *)0x0;
          fynp = (fy_node_pair *)fy_node_next(&(fyn->field_12).sequence,(fy_node *)fynp)) {
        apfStack_280[0] = (fy_node_pair *)0x131cd5;
        ic._4_4_ = fy_node_hash_internal((fy_node *)fynp,update_fn,state);
        if (ic._4_4_ != 0) {
          return ic._4_4_;
        }
        apfStack_280[0] = (fy_node_pair *)0x131d05;
      }
    }
    else if (local_264 == 2) {
      apfStack_280[0] = (fy_node_pair *)0x131d19;
      iVar5 = fy_node_mapping_item_count(fyn);
      lVar3 = -((long)iVar5 * 8 + 0x17U & 0xfffffffffffffff0);
      fynpp_00 = (fy_node_pair **)((long)apfStack_280 + lVar3 + 8);
      local_250 = iVar5;
      iter._512_8_ = fynpp_00;
      *(undefined8 *)((long)apfStack_280 + lVar3) = 0x131d5a;
      fy_node_mapping_perform_sort(fyn,(fy_node_mapping_sort_fn)0x0,(void *)0x0,fynpp_00,iVar5);
      *(undefined8 *)((long)apfStack_280 + lVar3) = 0x131d70;
      (*update_fn)(state,"M",1);
      for (rc = 0; rc < local_250; rc = rc + 1) {
        lVar1 = *(long *)(iter._512_8_ + (long)rc * 8);
        *(undefined8 *)((long)apfStack_280 + lVar3) = 0x131db5;
        (*update_fn)(state,"K",1);
        pfVar2 = *(fy_node **)(lVar1 + 0x10);
        *(undefined8 *)((long)apfStack_280 + lVar3) = 0x131dca;
        ic._4_4_ = fy_node_hash_internal(pfVar2,update_fn,state);
        if (ic._4_4_ != 0) {
          return ic._4_4_;
        }
        *(undefined8 *)((long)apfStack_280 + lVar3) = 0x131dfd;
        (*update_fn)(state,"V",1);
        pfVar2 = *(fy_node **)(lVar1 + 0x18);
        *(undefined8 *)((long)apfStack_280 + lVar3) = 0x131e12;
        iVar5 = fy_node_hash_internal(pfVar2,update_fn,state);
        if (iVar5 != 0) {
          return iVar5;
        }
        ic._4_4_ = 0;
      }
    }
  }
  return 0;
}

Assistant:

static int
fy_node_hash_internal(struct fy_node *fyn, fy_hash_update_fn update_fn, void *state) {
    struct fy_node *fyni;
    struct fy_node_pair *fynp;
    struct fy_node_pair **fynpp;
    struct fy_token_iter iter;
    int i, count, rc;
    const struct fy_iter_chunk *ic;

    if (!fyn) {
        /* NULL */
        update_fn(state, "s", 1);    /* as zero length scalar */
        return 0;
    }

    switch (fyn->type) {
        case FYNT_SEQUENCE:
            /* SEQUENCE */
            update_fn(state, "S", 1);

            for (fyni = fy_node_list_head(&fyn->sequence); fyni;
                 fyni = fy_node_next(&fyn->sequence, fyni)) {

                rc = fy_node_hash_internal(fyni, update_fn, state);
                if (rc)
                    return rc;
            }

            break;

        case FYNT_MAPPING:
            count = fy_node_mapping_item_count(fyn);

            fynpp = alloca(sizeof(*fynpp) * (count + 1));
            fy_node_mapping_perform_sort(fyn, NULL, NULL, fynpp, count);

            /* MAPPING */
            update_fn(state, "M", 1);

            for (i = 0; i < count; i++) {
                fynp = fynpp[i];

                /* MAPPING KEY */
                update_fn(state, "K", 1);
                rc = fy_node_hash_internal(fynp->key, update_fn, state);
                if (rc)
                    return rc;

                /* MAPPING VALUE */
                update_fn(state, "V", 1);
                rc = fy_node_hash_internal(fynp->value, update_fn, state);
                if (rc)
                    return rc;
            }

            break;

        case FYNT_SCALAR:
            update_fn(state, !fy_node_is_alias(fyn) ? "s" : "A", 1);

            fy_token_iter_start(fyn->scalar, &iter);
            ic = NULL;
            while ((ic = fy_token_iter_chunk_next(&iter, ic, &rc)) != NULL)
                update_fn(state, ic->str, ic->len);
            fy_token_iter_finish(&iter);

            break;
    }

    return 0;
}